

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_inherited(void)

{
  _func_int **pp_Var1;
  CTcTokenizer *this;
  tc_toktyp_t tVar2;
  CTcPrsNode *pCVar3;
  CTcFormalTypeList *this_00;
  CTcFormalTypeEle *pCVar4;
  CTcFormalTypeList *pCVar5;
  int iVar6;
  
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_LT) {
    this_00 = (CTcFormalTypeList *)CTcPrsMem::alloc(G_prsmem,0x18);
    this_00->head_ = (CTcFormalTypeEle *)0x0;
    this_00->tail_ = (CTcFormalTypeEle *)0x0;
    this_00->varargs_ = 0;
    CTcTokenizer::next(G_tok);
LAB_001fc933:
    while (this = G_tok, tVar2 = (G_tok->curtok_).typ_, (int)tVar2 < 0x15) {
      if (0x12 < (int)tVar2) {
        if (tVar2 != TOKT_LPAR) {
          if (tVar2 == TOKT_RPAR) goto LAB_001fca82;
          goto LAB_001fca73;
        }
LAB_001fcaad:
        CTcTokenizer::log_error_curtok(G_tok,0x2bcd);
        goto LAB_001fcac1;
      }
      if (tVar2 != TOKT_SYM) {
        if (tVar2 == TOKT_EOF) {
LAB_001fca82:
          CTcTokenizer::log_error_curtok(G_tok,0x2bcb);
          return (CTcPrsNode *)0x0;
        }
        goto LAB_001fca73;
      }
      CTcFormalTypeList::add_typed_param(this_00,&G_tok->curtok_);
LAB_001fc9a1:
      tVar2 = CTcTokenizer::next(G_tok);
      if ((int)tVar2 < 0x20) {
        if (tVar2 != TOKT_SYM) {
          if (tVar2 != TOKT_COMMA) goto LAB_001fc9df;
          goto LAB_001fc9ec;
        }
      }
      else if ((tVar2 != TOKT_TIMES) && (tVar2 != TOKT_ELLIPSIS)) {
        if (tVar2 != TOKT_GT) {
LAB_001fc9df:
          iVar6 = 0x2bcc;
          goto LAB_001fc9e7;
        }
        goto LAB_001fcabc;
      }
      CTcTokenizer::log_error_curtok(G_tok,0x2bcc);
    }
    if ((int)tVar2 < 0x20) {
      if (tVar2 == TOKT_COMMA) {
        iVar6 = 0x2bcb;
LAB_001fc9e7:
        CTcTokenizer::log_error_curtok(G_tok,iVar6);
LAB_001fc9ec:
        CTcTokenizer::next(G_tok);
        goto LAB_001fc933;
      }
    }
    else if ((int)tVar2 < 0x23) {
      if (tVar2 == TOKT_TIMES) {
        pCVar4 = (CTcFormalTypeEle *)CTcPrsMem::alloc(G_prsmem,0x18);
        pCVar4->name_ = (char *)0x0;
        pCVar5 = (CTcFormalTypeList *)this_00->tail_;
        if ((CTcFormalTypeList *)this_00->tail_ == (CTcFormalTypeList *)0x0) {
          pCVar5 = this_00;
        }
        pCVar5->head_ = pCVar4;
        this_00->tail_ = pCVar4;
        pCVar4->nxt_ = (CTcFormalTypeEle *)0x0;
        goto LAB_001fc9a1;
      }
    }
    else {
      if (tVar2 == TOKT_ELLIPSIS) {
        this_00->varargs_ = 1;
        tVar2 = CTcTokenizer::next(this);
        if (tVar2 != TOKT_GT) goto LAB_001fcaad;
        goto LAB_001fcabc;
      }
      if (tVar2 == TOKT_SEM) goto LAB_001fca82;
      if (tVar2 == TOKT_GT) goto LAB_001fcabc;
    }
LAB_001fca73:
    iVar6 = 0x2bcb;
    goto LAB_001fcaf8;
  }
  if (tVar2 == TOKT_SYM) {
    pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pp_Var1 = (_func_int **)(G_tok->curtok_).text_len_;
    pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)(G_tok->curtok_).text_;
    pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314648;
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(G_tok);
  }
  else {
    pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
    pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00319d78;
    G_prs->full_method_ctx_referenced_ = 1;
  }
LAB_001fca42:
  pCVar3 = parse_member(pCVar3);
  return pCVar3;
LAB_001fcabc:
  CTcTokenizer::next(G_tok);
LAB_001fcac1:
  pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00319d78;
  pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
  if ((G_tok->curtok_).typ_ != TOKT_LPAR) {
    iVar6 = 0x2bce;
LAB_001fcaf8:
    CTcTokenizer::log_error_curtok(G_tok,iVar6);
    CTcParser::skip_to_sem();
    return (CTcPrsNode *)0x0;
  }
  goto LAB_001fca42;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_inherited()
{
    CTcPrsNode *lhs;
    
    /* skip the "inherited" keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* 
         *   it's an "inherited superclass..." expression - set up the
         *   "inherited superclass" node 
         */
        lhs = new CTPNInhClass(G_tok->getcur()->get_text(),
                               G_tok->getcur()->get_text_len());

        /* this passes method context information to the inheritor */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* skip the superclass token */
        G_tok->next();

        /* parse the member expression portion normally */
        break;

    case TOKT_LT:
        /* 
         *   '<' - this is the start of a multi-method type list.  Parse the
         *   list: type1 ',' type2 ',' ... '>', then the argument list to the
         *   'inherited' call.  
         */
        {
            /* create the formal type list */
            CTcFormalTypeList *tl = new (G_prsmem)CTcFormalTypeList();

            /* skip the '<' */
            G_tok->next();

            /* parse each list element */
            for (int done = FALSE ; !done ; )
            {
                switch (G_tok->cur())
                {
                case TOKT_GT:
                    /* end of the list - skip the '>', and we're done */
                    G_tok->next();
                    done = TRUE;
                    break;

                case TOKT_ELLIPSIS:
                    /* '...' */
                    tl->add_ellipsis();

                    /* this has to be the end of the list */
                    if (G_tok->next() == TOKT_GT)
                        G_tok->next();
                    else
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);

                    /* assume the list ends here in any case */
                    done = TRUE;
                    break;

                case TOKT_SYM:
                    /* a type token - add it to the list */
                    tl->add_typed_param(G_tok->getcur());

                finish_type:
                    /* skip the type token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                        /* another type follows */
                        G_tok->next();
                        break;

                    case TOKT_GT:
                        G_tok->next();
                        done = TRUE;
                        break;

                    case TOKT_SYM:
                    case TOKT_ELLIPSIS:
                    case TOKT_TIMES:
                        /* probably just a missing comma */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        break;

                    default:
                        /* anything else is an error */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        G_tok->next();
                        break;
                    }
                    break;

                case TOKT_TIMES:
                    /* '*' indicates an untyped parameter */
                    tl->add_untyped_param();
                    goto finish_type;

                case TOKT_LPAR:
                    /* probably a missing '>' */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);
                    done = TRUE;
                    break;

                case TOKT_COMMA:
                    /* probably a missing type */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_tok->next();
                    break;

                case TOKT_SEM:
                case TOKT_RPAR:
                case TOKT_EOF:
                    /* all of these indicate a premature end of the list */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    return 0;

                default:
                    /* anything else is an error */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_prs->skip_to_sem();
                    return 0;
                }
            }

            /* the left-hand side is an "inherited" node, with the arg list */
            lhs = new CTPNInh();
            ((CTPNInh *)lhs)->set_typelist(tl);

            /* an inherited<> expression must have an argument list */
            if (G_tok->cur() != TOKT_LPAR)
            {
                G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_LIST);
                G_prs->skip_to_sem();
                return 0;
            }
        }
        break;
        
    default:
        /*
         *   There's no explicit superclass name listed, so the left-hand
         *   side of the '.' expression is the simple "inherited" node. 
         */
        lhs = new CTPNInh();

        /*
         *   Since we don't have an explicit superclass, we'll need the
         *   method context at run-time to establish the next class in
         *   inheritance order.  Flag the need for the full method context.  
         */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* parse the member expression portion normally */
        break;
    }

    /* parse and return the member expression */
    return parse_member(lhs);
}